

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O0

bool __thiscall
cmCursesOptionsWidget::HandleInput
          (cmCursesOptionsWidget *this,int *key,cmCursesMainForm *param_2,WINDOW *w)

{
  int iVar1;
  int local_6c;
  int local_5c;
  int local_4c;
  WINDOW *w_local;
  cmCursesMainForm *param_2_local;
  int *key_local;
  cmCursesOptionsWidget *this_local;
  
  iVar1 = *key;
  if (iVar1 == 2) {
LAB_0013c3a0:
    if (w == (WINDOW *)0x0) {
      local_5c = -1;
    }
    else {
      local_5c = w->_maxy + 1;
    }
    wtouchln(w,0,local_5c,1);
    wrefresh(w);
    PreviousOption(this);
  }
  else {
    if (iVar1 == 6) {
LAB_0013c3f5:
      NextOption(this);
      if (w == (WINDOW *)0x0) {
        local_6c = -1;
      }
      else {
        local_6c = w->_maxy + 1;
      }
      wtouchln(w,0,local_6c,1);
      wrefresh(w);
      return true;
    }
    if (iVar1 != 10) {
      if (iVar1 == 0x104) goto LAB_0013c3a0;
      if (iVar1 == 0x105) goto LAB_0013c3f5;
      if (iVar1 != 0x157) {
        return false;
      }
    }
    NextOption(this);
    if (w == (WINDOW *)0x0) {
      local_4c = -1;
    }
    else {
      local_4c = w->_maxy + 1;
    }
    wtouchln(w,0,local_4c,1);
    wrefresh(w);
  }
  return true;
}

Assistant:

bool cmCursesOptionsWidget::HandleInput(int& key, cmCursesMainForm* /*fm*/,
                                        WINDOW* w)
{
  switch (key) {
    case 10: // 10 == enter
    case KEY_ENTER:
      this->NextOption();
      touchwin(w);
      wrefresh(w);
      return true;
    case KEY_LEFT:
    case ctrl('b'):
      touchwin(w);
      wrefresh(w);
      this->PreviousOption();
      return true;
    case KEY_RIGHT:
    case ctrl('f'):
      this->NextOption();
      touchwin(w);
      wrefresh(w);
      return true;
    default:
      return false;
  }
}